

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

UA_StatusCode UA_decodeBinaryInternal(void *dst,UA_DataType *type)

{
  byte bVar1;
  UA_DataTypeMember *pUVar2;
  uint uVar3;
  ulong uVar4;
  UA_DataType *type_00;
  ulong uVar5;
  long lVar6;
  size_t *length;
  size_t *out_length;
  uint uVar7;
  UA_DataType *typelists [2];
  
  bVar1 = type->membersSize;
  typelists[1] = type;
  typelists[0] = type + -(ulong)type->typeIndex;
  uVar7 = 0;
  for (lVar6 = 0; (ulong)bVar1 * 0x10 != lVar6; lVar6 = lVar6 + 0x10) {
    pUVar2 = typelists[1]->members;
    type_00 = typelists[(ulong)(~(uint)(byte)(&pUVar2->field_0xb)[lVar6] & 1) - 1] +
              *(ushort *)((long)&pUVar2->memberTypeIndex + lVar6);
    out_length = (size_t *)((long)dst + (ulong)(&pUVar2->padding)[lVar6]);
    if (((&pUVar2->field_0xb)[lVar6] & 2) == 0) {
      uVar4 = 0x19;
      if ((type_00->field_0x25 & 1) != 0) {
        uVar4 = (ulong)type_00->typeIndex;
      }
      uVar5 = (ulong)type_00->memSize;
      uVar3 = (*(code *)(&decodeBinaryJumpTable)[uVar4])(out_length,type_00);
    }
    else {
      uVar3 = Array_decodeBinary((void **)(out_length + 1),out_length,type_00);
      uVar5 = 0x10;
    }
    dst = (void *)((long)out_length + uVar5);
    uVar7 = uVar7 | uVar3;
  }
  return uVar7;
}

Assistant:

static UA_StatusCode
UA_decodeBinaryInternal(void *dst, const UA_DataType *type) {
    uintptr_t ptr = (uintptr_t)dst;
    UA_StatusCode retval = UA_STATUSCODE_GOOD;
    UA_Byte membersSize = type->membersSize;
    const UA_DataType *typelists[2] = { UA_TYPES, &type[-type->typeIndex] };
    for(size_t i = 0; i < membersSize; ++i) {
        const UA_DataTypeMember *member = &type->members[i];
        const UA_DataType *membertype = &typelists[!member->namespaceZero][member->memberTypeIndex];
        if(!member->isArray) {
            ptr += member->padding;
            size_t fi = membertype->builtin ? membertype->typeIndex : UA_BUILTIN_TYPES_COUNT;
            size_t memSize = membertype->memSize;
            retval |= decodeBinaryJumpTable[fi]((void *UA_RESTRICT)ptr, membertype);
            ptr += memSize;
        } else {
            ptr += member->padding;
            size_t *length = (size_t*)ptr;
            ptr += sizeof(size_t);
            retval |= Array_decodeBinary((void *UA_RESTRICT *UA_RESTRICT)ptr, length, membertype);
            ptr += sizeof(void*);
        }
    }
    return retval;
}